

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

char * __thiscall FString::LockNewBuffer(FString *this,size_t len)

{
  FStringData *pFVar1;
  size_t len_local;
  FString *this_local;
  
  pFVar1 = Data(this);
  FStringData::Release(pFVar1);
  AllocBuffer(this,len);
  pFVar1 = Data(this);
  if (pFVar1->RefCount == 1) {
    pFVar1 = Data(this);
    pFVar1->RefCount = -1;
    return this->Chars;
  }
  __assert_fail("Data()->RefCount == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/zstring.cpp"
                ,0xa3,"char *FString::LockNewBuffer(size_t)");
}

Assistant:

char *FString::LockNewBuffer(size_t len)
{
	Data()->Release();
	AllocBuffer(len);
	assert(Data()->RefCount == 1);
	Data()->RefCount = -1;
	return Chars;
}